

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int generate_by_miniscript_and_n
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  int iVar1;
  size_t local_68;
  size_t indexes [2];
  uchar local_4c;
  uchar local_4b [3];
  uchar last_op [1];
  size_t *psStack_48;
  uchar middle_op [3];
  size_t *write_len_local;
  size_t script_len_local;
  uchar *script_local;
  int32_t derive_child_num_local;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  local_4b[0] = 'd';
  local_4b[1] = '\0';
  local_4b[2] = 0x67;
  local_4c = 'h';
  local_68 = 0;
  indexes[0] = 1;
  psStack_48 = write_len;
  iVar1 = generate_by_miniscript_concat
                    (node,parent,derive_child_num,2,&local_68,(uchar *)0x0,0,local_4b,3,(uchar *)0x0
                     ,0,&local_4c,1,script,script_len,write_len);
  return iVar1;
}

Assistant:

static int generate_by_miniscript_and_n(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    unsigned char middle_op[] = {OP_NOTIF, OP_0, OP_ELSE};
    unsigned char last_op[] = {OP_ENDIF};
    const size_t indexes[] = {0, 1};
    /* [X] NOTIF 0 ELSE [Y] ENDIF */
    return generate_by_miniscript_concat(
        node,
        parent,
        derive_child_num,
        2,
        indexes,
        NULL,
        0,
        middle_op,
        sizeof(middle_op) / sizeof(unsigned char),
        NULL,
        0,
        last_op,
        sizeof(last_op) / sizeof(unsigned char),
        script,
        script_len,
        write_len);
}